

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

string * deqp::gles3::Performance::repeatIndexedTemplate
                   (string *__return_storage_ptr__,string *strTempl,int numRepeats,string *delim,
                   int ndxStart)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  mapped_type *pmVar3;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  bool bVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  StringTemplate templ;
  ostringstream s;
  long *local_258 [2];
  long local_248 [2];
  int local_234;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  string *local_228;
  string *local_220;
  string local_218;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  StringTemplate local_1c8;
  key_type local_1a8 [3];
  ios_base local_138 [264];
  
  local_220 = delim;
  tcu::StringTemplate::StringTemplate(&local_1c8,strTempl);
  local_230 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_230;
  iVar6 = 0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1f8._M_impl.super__Rb_tree_header._M_header;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1f8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_234 = numRepeats;
  local_228 = __return_storage_ptr__;
  local_1f8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numRepeats) {
    paVar1 = &local_1a8[0].field_2;
    local_234 = -numRepeats;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,ndxStart + -1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"PREV_NDX","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_1f8,local_1a8);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,ndxStart);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"NDX","");
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_1f8,local_1a8);
      std::__cxx11::string::operator=((string *)pmVar3,(string *)local_258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      local_258[0] = local_248;
      bVar7 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
      }
      else {
        pcVar2 = (local_220->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pcVar2,pcVar2 + local_220->_M_string_length);
      }
      tcu::StringTemplate::specialize
                (&local_218,&local_1c8,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1f8);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_218,0,(char *)0x0,(ulong)local_258[0]);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_1a8[0].field_2._0_8_ = *psVar5;
        local_1a8[0].field_2._8_8_ = plVar4[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar5;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1a8[0]._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_228,(ulong)local_1a8[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      ndxStart = ndxStart + 1;
    } while (local_234 != iVar6);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f8);
  tcu::StringTemplate::~StringTemplate(&local_1c8);
  return local_228;
}

Assistant:

static inline string repeatIndexedTemplate (const string& strTempl, int numRepeats, const string& delim = "", int ndxStart = 0)
{
	const tcu::StringTemplate	templ(strTempl);
	string						result;
	std::map<string, string>	params;

	for (int i = 0; i < numRepeats; i++)
	{
		params["PREV_NDX"]	= toString(i + ndxStart - 1);
		params["NDX"]		= toString(i + ndxStart);

		result += (i > 0 ? delim : "") + templ.specialize(params);
	}

	return result;
}